

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O3

bool crnlib::string_to_int(char **pBuf,int *value)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  
  *value = 0;
  cVar1 = **pBuf;
  pcVar8 = *pBuf;
  while( true ) {
    if (cVar1 == '\0') {
      return false;
    }
    pcVar7 = pcVar8 + 1;
    iVar3 = isspace((int)cVar1);
    if (iVar3 == 0) break;
    cVar1 = *pcVar7;
    pcVar8 = pcVar7;
  }
  uVar6 = (int)cVar1 - 0x3a;
  if ((uVar6 < 0xfffffff6) && (pcVar8 = pcVar7, cVar1 != '-')) {
    return false;
  }
  uVar4 = 0;
  while( true ) {
    if ((*pcVar8 == '\0') || (uVar5 = (int)*pcVar8 - 0x30, 9 < uVar5)) {
      if (uVar6 < 0xfffffff6) {
        if (0x80000000 < uVar4) {
          return false;
        }
        uVar4 = -uVar4;
      }
      else if ((int)uVar4 < 0) {
        return false;
      }
      *value = uVar4;
      *pBuf = pcVar8;
      return true;
    }
    if (0x1fffffff < uVar4) {
      return false;
    }
    if (CARRY4(uVar4 * 8,uVar4 * 2)) break;
    uVar2 = uVar4 * 10;
    pcVar8 = pcVar8 + 1;
    uVar4 = uVar2 + uVar5;
    if (CARRY4(uVar2,uVar5)) {
      return false;
    }
  }
  return false;
}

Assistant:

bool string_to_int(const char*& pBuf, int& value)
    {
        value = 0;

        CRNLIB_ASSERT(pBuf);
        const char* p = pBuf;

        while (*p && isspace(*p))
        {
            p++;
        }

        uint result = 0;
        bool negative = false;

        if (!isdigit(*p))
        {
            if (p[0] == '-')
            {
                negative = true;
                p++;
            }
            else
            {
                return false;
            }
        }

        while (*p && isdigit(*p))
        {
            if (result & 0xE0000000U)
            {
                return false;
            }

            const uint result8 = result << 3U;
            const uint result2 = result << 1U;

            if (result2 > (0xFFFFFFFFU - result8))
            {
                return false;
            }

            result = result8 + result2;

            uint c = p[0] - '0';
            if (c > (0xFFFFFFFFU - result))
            {
                return false;
            }

            result += c;

            p++;
        }

        if (negative)
        {
            if (result > 0x80000000U)
            {
                value = 0;
                return false;
            }
            value = -static_cast<int>(result);
        }
        else
        {
            if (result > 0x7FFFFFFFU)
            {
                value = 0;
                return false;
            }
            value = static_cast<int>(result);
        }

        pBuf = p;

        return true;
    }